

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

string * showReason_abi_cxx11_(Reason r)

{
  uint uVar1;
  uint uVar2;
  Lit p;
  Clause *pCVar3;
  Lit *pLVar4;
  ostream *poVar5;
  string *in_RDI;
  uint i;
  Clause *c;
  stringstream ss;
  int in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  string local_250 [32];
  int local_230;
  int local_22c;
  string local_228 [32];
  int local_208;
  int local_204;
  string local_200 [32];
  int local_1e0;
  int local_1dc;
  string local_1d8 [36];
  uint local_1b4;
  Clause *local_1b0;
  stringstream local_198 [16];
  ostream local_188 [212];
  int in_stack_ffffffffffffff4c;
  Reason local_10 [2];
  
  std::__cxx11::stringstream::stringstream(local_198);
  uVar1 = Reason::type(local_10);
  switch(uVar1) {
  case 0:
    pCVar3 = Reason::pt(local_10);
    if (pCVar3 == (Clause *)0x0) {
      std::operator<<(local_188,"no reason");
    }
    else {
      local_1b0 = Reason::pt(local_10);
      std::operator<<(local_188,"clause");
      for (local_1b4 = 0; uVar1 = local_1b4, uVar2 = Clause::size(local_1b0), uVar1 < uVar2;
          local_1b4 = local_1b4 + 1) {
        poVar5 = std::operator<<(local_188," ");
        pLVar4 = Clause::operator[]((Clause *)
                                    CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                    in_stack_fffffffffffffd0c);
        local_1e0 = pLVar4->x;
        local_1dc = (int)operator~((Lit)0x292462);
        toInt((Lit)local_1dc);
        getLitString_abi_cxx11_(in_stack_ffffffffffffff4c);
        std::operator<<(poVar5,local_1d8);
        std::__cxx11::string::~string(local_1d8);
      }
    }
    break;
  case 1:
    std::operator<<(local_188,"absorbed binary clause?");
    break;
  case 2:
    poVar5 = std::operator<<(local_188,"single literal ");
    Reason::d1(local_10);
    local_208 = (int)toLit(0x29254e);
    local_204 = (int)operator~((Lit)0x29256b);
    toInt((Lit)local_204);
    getLitString_abi_cxx11_(in_stack_ffffffffffffff4c);
    std::operator<<(poVar5,local_200);
    std::__cxx11::string::~string(local_200);
    break;
  case 3:
    poVar5 = std::operator<<(local_188,"two literals ");
    Reason::d1(local_10);
    local_230 = (int)toLit(0x292624);
    local_22c = (int)operator~((Lit)0x292641);
    toInt((Lit)local_22c);
    getLitString_abi_cxx11_(in_stack_ffffffffffffff4c);
    poVar5 = std::operator<<(poVar5,local_228);
    poVar5 = std::operator<<(poVar5," & ");
    Reason::d2(local_10);
    toLit(0x2926c4);
    p = operator~((Lit)0x2926e1);
    toInt(p);
    getLitString_abi_cxx11_(in_stack_ffffffffffffff4c);
    std::operator<<(poVar5,local_250);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_228);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string showReason(Reason r) {
	std::stringstream ss;
	switch (r.type()) {
		case 0:
			if (r.pt() == nullptr) {
				ss << "no reason";
			} else {
				Clause& c = *r.pt();
				ss << "clause";
				for (unsigned int i = 0; i < c.size(); i++) {
					ss << " " << getLitString(toInt(~c[i]));
				}
			}
			break;
		case 1:
			ss << "absorbed binary clause?";
			break;
		case 2:
			ss << "single literal " << getLitString(toInt(~toLit(r.d1())));
			break;
		case 3:
			ss << "two literals " << getLitString(toInt(~toLit((r.d1())))) << " & "
				 << getLitString(toInt(~toLit((r.d2()))));
			break;
		default:
			assert(false);
	}
	return ss.str();
}